

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O1

void deqp::egl::Image::checkCallReturn<unsigned_int>
               (EglTestContext *eglTestCtx,char *call,uint returnValue,uint expectReturnValue,
               EGLint expectError)

{
  TestContext *this;
  TestLog *pTVar1;
  int iVar2;
  size_t sVar3;
  Library *pLVar4;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  ios_base local_138 [264];
  
  this = eglTestCtx->m_testCtx;
  pTVar1 = this->m_log;
  local_1b0 = (undefined1  [8])pTVar1;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  if (call == (char *)0x0) {
    std::ios::clear((int)local_1a8[-3] + (int)(ostringstream *)&local_1a8);
  }
  else {
    sVar3 = strlen(call);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,call,sVar3);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  pLVar4 = EglTestContext::getLibrary(eglTestCtx);
  iVar2 = (*pLVar4->_vptr_Library[0x1f])(pLVar4);
  if (returnValue != expectReturnValue) {
    local_1b0 = (undefined1  [8])pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  Fail: Return value mismatch! Expected ",0x28);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", got ",6);
    std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    if (this->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this,QP_TEST_RESULT_FAIL,"Invalid return value");
    }
  }
  if (iVar2 != expectError) {
    local_1b0 = (undefined1  [8])pTVar1;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1a8,"  Fail: Error code mismatch! Expected ",0x26);
    local_1c0.m_getName = eglu::getErrorName;
    local_1c0.m_value = expectError;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)&local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,", got ",6);
    local_1d0.m_getName = eglu::getErrorName;
    local_1d0.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)&local_1a8);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
    std::ios_base::~ios_base(local_138);
    if (this->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this,QP_TEST_RESULT_FAIL,"Invalid error code");
    }
  }
  return;
}

Assistant:

void checkCallReturn (EglTestContext& eglTestCtx, const char* call, RetVal returnValue, RetVal expectReturnValue, EGLint expectError)
{
	tcu::TestContext&	testCtx		= eglTestCtx.getTestContext();
	TestLog&			log			= testCtx.getLog();
	EGLint				error;

	log << TestLog::Message << call << TestLog::EndMessage;

	error = eglTestCtx.getLibrary().getError();

	if (returnValue != expectReturnValue)
	{
		log << TestLog::Message << "  Fail: Return value mismatch! Expected " << expectReturnValue << ", got " << returnValue << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid return value");
	}

	if (error != expectError)
	{
		log << TestLog::Message << "  Fail: Error code mismatch! Expected " << eglu::getErrorStr(expectError) << ", got " << eglu::getErrorStr(error) << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error code");
	}
}